

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefCast(TranslateToFuzzReader *this,Type type)

{
  Type TVar1;
  uint32_t uVar2;
  BasicHeapType BVar3;
  BasicHeapType BVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  HeapType local_40;
  HeapType local_38;
  Type local_30;
  Type type_local;
  Type refType;
  
  local_30.id = type.id;
  if ((type.id < 7) || ((type.id & 1) != 0)) {
    __assert_fail("type.isRef()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x12c8,"Expression *wasm::TranslateToFuzzReader::makeRefCast(Type)");
  }
  if ((~(this->wasm->features).features & 0x500) != 0) {
    __assert_fail("wasm.features.hasReferenceTypes() && wasm.features.hasGC()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x12c9,"Expression *wasm::TranslateToFuzzReader::makeRefCast(Type)");
  }
  type_local.id = 0;
  uVar2 = Random::upTo(&this->random,3);
  if (uVar2 == 2) {
    type_local = getSubType(this,type);
  }
  else {
    if (uVar2 != 1) {
      if (uVar2 != 0) {
        wasm::handle_unreachable
                  ("bad case",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0x12e4);
      }
      type_local = getReferenceType(this);
      local_40 = Type::getHeapType(&type_local);
      BVar3 = HeapType::getBottom(&local_40);
      local_38 = Type::getHeapType(&local_30);
      BVar4 = HeapType::getBottom(&local_38);
      type.id = local_30.id;
      if (BVar3 == BVar4) goto LAB_0014ac27;
    }
    type_local = getSuperType(this,type);
  }
LAB_0014ac27:
  pEVar5 = make(this,type_local);
  TVar1.id = local_30.id;
  pEVar6 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
  pEVar6->_id = RefCastId;
  *(Expression **)(pEVar6 + 1) = pEVar5;
  (pEVar6->type).id = TVar1.id;
  wasm::RefCast::finalize();
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeRefCast(Type type) {
  assert(type.isRef());
  assert(wasm.features.hasReferenceTypes() && wasm.features.hasGC());
  // As with RefTest, use possibly related types. Unlike there, we are given the
  // output type, which is the cast type, so just generate the ref's type.
  Type refType;
  switch (upTo(3)) {
    case 0:
      // Totally random.
      refType = getReferenceType();
      // They must share a bottom type in order to validate.
      if (refType.getHeapType().getBottom() == type.getHeapType().getBottom()) {
        break;
      }
      // Otherwise, fall through and generate things in a way that is
      // guaranteed to validate.
      [[fallthrough]];
    case 1: {
      // Cast is a subtype of ref. We can't modify |type|, so find a supertype
      // for the ref.
      refType = getSuperType(type);
      break;
    }
    case 2:
      // Ref is a subtype of cast.
      refType = getSubType(type);
      break;
    default:
      // This unreachable avoids a warning on refType being possibly undefined.
      WASM_UNREACHABLE("bad case");
  }
  return builder.makeRefCast(make(refType), type);
}